

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cc
# Opt level: O2

void __thiscall raptor::Slice::Slice(Slice *this,char *ptr,size_t len)

{
  SliceRefCount *pSVar1;
  
  if (len == 0) {
    (this->_data).refcounted.bytes = (uint8_t *)0x0;
    *(undefined8 *)((long)&this->_data + 0x10) = 0;
    this->_refs = (SliceRefCount *)0x0;
    (this->_data).refcounted.length = 0;
    return;
  }
  if (len < 0x18) {
    this->_refs = (SliceRefCount *)0x0;
    (this->_data).inlined.length = (uint8_t)len;
    if (ptr == (char *)0x0) {
      return;
    }
    pSVar1 = (SliceRefCount *)((long)&this->_data + 1);
  }
  else {
    pSVar1 = (SliceRefCount *)Malloc(len + 4);
    this->_refs = pSVar1;
    (pSVar1->_refs)._value.super___atomic_base<int>._M_i = 0;
    (pSVar1->_refs)._value.super___atomic_base<int>._M_i = 1;
    (this->_data).refcounted.length = len;
    pSVar1 = this->_refs + 1;
    (this->_data).refcounted.bytes = (uint8_t *)pSVar1;
    if (ptr == (char *)0x0) {
      return;
    }
  }
  memcpy(pSVar1,ptr,len);
  return;
}

Assistant:

Slice::Slice(const char* ptr, size_t len) {
    if (len == 0) {  // empty object
        _refs = nullptr;
        memset(&_data, 0, sizeof(_data));
        return;
    }

    if (len <= SLICE_INLINED_SIZE) {
        _refs = nullptr;
        _data.inlined.length = static_cast<uint8_t>(len);
        if (ptr) {
            memcpy(_data.inlined.bytes, ptr, len);
        }
    } else {
        /*  Memory layout used by the slice created here:

            +-----------+----------------------------------------------------------+
            | refcount  | bytes                                                    |
            +-----------+----------------------------------------------------------+

            refcount is a SliceRefCount
            bytes is an array of bytes of the requested length
        */

        _refs = (SliceRefCount*)Malloc(sizeof(SliceRefCount) + len);
        new (_refs) SliceRefCount;
        _data.refcounted.length = len;
        _data.refcounted.bytes = reinterpret_cast<uint8_t*>(_refs + 1);
        if (ptr) {
            memcpy(_data.refcounted.bytes, ptr, len);
        }
    }
}